

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase881::run(TestCase881 *this)

{
  Builder builder_00;
  Reader reader;
  int local_1d0;
  uint local_1cc;
  Orphan<capnp::List<int,_(capnp::Kind)0>_> orphan_1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  Builder local_178;
  Builder root;
  Reader local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField(&orphan,&root);
  if ((CONCAT44(orphan.builder.location._4_4_,(uint)orphan.builder.location) != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x377,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::applyReader
            (&local_128,&orphan.builder);
  reader._reader.capTable = local_128._reader.capTable;
  reader._reader.segment = local_128._reader.segment;
  reader._reader.data = local_128._reader.data;
  reader._reader.pointers = local_128._reader.pointers;
  reader._reader.dataSize = local_128._reader.dataSize;
  reader._reader.pointerCount = local_128._reader.pointerCount;
  reader._reader._38_2_ = local_128._reader._38_2_;
  reader._reader.nestingLimit = local_128._reader.nestingLimit;
  reader._reader._44_4_ = local_128._reader._44_4_;
  checkTestMessageAllZero(reader);
  if ((CONCAT44(orphan.builder.location._4_4_,(uint)orphan.builder.location) != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37a,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&local_178,&orphan.builder);
  builder_00._builder.capTable = local_178._builder.capTable;
  builder_00._builder.segment = local_178._builder.segment;
  builder_00._builder.data = local_178._builder.data;
  builder_00._builder.pointers = local_178._builder.pointers;
  builder_00._builder.dataSize = local_178._builder.dataSize;
  builder_00._builder.pointerCount = local_178._builder.pointerCount;
  builder_00._builder._38_2_ = local_178._builder._38_2_;
  checkTestMessageAllZero(builder_00);
  if ((CONCAT44(orphan.builder.location._4_4_,(uint)orphan.builder.location) == 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[38]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x37e,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
               (char (*) [38])"failed: expected !(orphan == nullptr)");
  }
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownInt32List(&orphan_1,&root);
  if ((orphan_1.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,899,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            ((Reader *)&orphan,&orphan_1.builder);
  if ((uint)orphan.builder.location != 0 && kj::_::Debug::minSeverity < 3) {
    local_1d0 = 0;
    OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
              ((Reader *)&orphan,&orphan_1.builder);
    local_1cc = (uint)orphan.builder.location;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x385,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",&local_1d0,
               &local_1cc);
  }
  if ((orphan_1.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x386,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            ((Builder *)&orphan,&orphan_1.builder);
  if ((uint)orphan.builder.location != 0 && kj::_::Debug::minSeverity < 3) {
    local_1d0 = 0;
    OrphanGetImpl<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
              ((Builder *)&orphan,&orphan_1.builder);
    local_1cc = (uint)orphan.builder.location;
    kj::_::Debug::log<char_const(&)[46],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", 0, orphan.get().size()",
               (char (*) [46])"failed: expected (0) == (orphan.get().size())",&local_1d0,&local_1cc)
    ;
  }
  if ((orphan_1.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x389,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::~OrphanBuilder(&orphan_1.builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructList
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &orphan_1,&root);
  if ((orphan_1.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x38e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::applyReader((Reader *)&orphan,&orphan_1.builder);
  if ((uint)orphan.builder.location != 0 && kj::_::Debug::minSeverity < 3) {
    local_1d0 = 0;
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::applyReader((Reader *)&orphan,&orphan_1.builder);
    local_1cc = (uint)orphan.builder.location;
    kj::_::Debug::log<char_const(&)[52],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x390,ERROR,
               "\"failed: expected \" \"(0) == (orphan.getReader().size())\", 0, orphan.getReader().size()"
               ,(char (*) [52])"failed: expected (0) == (orphan.getReader().size())",&local_1d0,
               &local_1cc);
  }
  if ((orphan_1.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x391,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&orphan,&orphan_1.builder);
  if ((uint)orphan.builder.location != 0 && kj::_::Debug::minSeverity < 3) {
    local_1d0 = 0;
    OrphanGetImpl<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::apply((Builder *)&orphan,&orphan_1.builder);
    local_1cc = (uint)orphan.builder.location;
    kj::_::Debug::log<char_const(&)[46],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x393,ERROR,
               "\"failed: expected \" \"(0) == (orphan.get().size())\", 0, orphan.get().size()",
               (char (*) [46])"failed: expected (0) == (orphan.get().size())",&local_1d0,&local_1cc)
    ;
  }
  if ((orphan_1.builder.location != (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x394,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
               (char (*) [35])"failed: expected orphan == nullptr");
  }
  OrphanBuilder::~OrphanBuilder(&orphan_1.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, DisownNull) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphan<TestAllTypes> orphan = root.disownStructField();
    EXPECT_TRUE(orphan == nullptr);

    checkTestMessageAllZero(orphan.getReader());
    EXPECT_TRUE(orphan == nullptr);

    // get()ing the orphan allocates an object, for security reasons.
    checkTestMessageAllZero(orphan.get());
    EXPECT_FALSE(orphan == nullptr);
  }

  {
    Orphan<List<int32_t>> orphan = root.disownInt32List();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }

  {
    Orphan<List<TestAllTypes>> orphan = root.disownStructList();
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.getReader().size());
    EXPECT_TRUE(orphan == nullptr);

    EXPECT_EQ(0, orphan.get().size());
    EXPECT_TRUE(orphan == nullptr);
  }
}